

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::read_pvtu
               (path *pvtupath,CommPtr *comm,I32 *npieces_out,path *vtupath_out,
               Int *nghost_layers_out)

{
  char cVar1;
  value_type *pvVar2;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  string vtupath;
  path local_290;
  path parentpath;
  path local_250;
  ifstream stream;
  
  filesystem::path::parent_path(&parentpath,pvtupath);
  vtupath._M_dataplus._M_p = (pointer)&vtupath.field_2;
  vtupath._M_string_length = 0;
  vtupath.field_2._M_local_buf[0] = '\0';
  pvVar2 = filesystem::path::c_str(pvtupath);
  std::ifstream::ifstream(&stream,pvVar2,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2c0,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    read_pvtu((istream *)&stream,(CommPtr *)&local_2c0,npieces_out,&vtupath,nghost_layers_out);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
    filesystem::path::path(&local_290,&vtupath);
    filesystem::operator/(&local_250,&parentpath,&local_290);
    std::__cxx11::string::operator=((string *)vtupath_out,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_290);
    std::ifstream::~ifstream(&stream);
    std::__cxx11::string::~string((string *)&vtupath);
    std::__cxx11::string::~string((string *)&parentpath);
    return;
  }
  pvVar2 = filesystem::path::c_str(pvtupath);
  fail("couldn\'t open \"%s\"\n",pvVar2);
}

Assistant:

void read_pvtu(filesystem::path const& pvtupath, CommPtr comm, I32* npieces_out,
    filesystem::path* vtupath_out, Int* nghost_layers_out) {
  auto parentpath = pvtupath.parent_path();
  std::string vtupath;
  std::ifstream stream(pvtupath.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("couldn't open \"%s\"\n", pvtupath.c_str());
  }
  read_pvtu(stream, comm, npieces_out, &vtupath, nghost_layers_out);
  *vtupath_out = parentpath / vtupath;
}